

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_job.h
# Opt level: O2

void __thiscall
r_exec::SaliencyPropagationJob::~SaliencyPropagationJob(SaliencyPropagationJob *this)

{
  (this->super_TimeJob).super__Object._vptr__Object =
       (_func_int **)&PTR__SaliencyPropagationJob_001d3478;
  core::P<r_code::Code>::~P(&this->object);
  return;
}

Assistant:

class REPLICODE_EXPORT SaliencyPropagationJob:
    public TimeJob
{
public:
    core::P<r_code::Code> object;
    double sln_change;
    double source_sln_thr;
    SaliencyPropagationJob(r_code::Code *o, double sln_change, double source_sln_thr, uint64_t ijt);
    bool update();
    void report(int64_t lag) const;
}